

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_math.c
# Opt level: O0

void sincosd(double angle,double *s,double *c)

{
  int iVar1;
  double *in_RSI;
  double *in_RDI;
  double in_XMM0_Qa;
  double dVar2;
  int i;
  
  dVar2 = fmod(in_XMM0_Qa,90.0);
  if ((dVar2 != 0.0) || (NAN(dVar2))) {
switchD_001123a1_default:
    dVar2 = sin(in_XMM0_Qa * 0.017453292519943295);
    *in_RDI = dVar2;
    dVar2 = cos(in_XMM0_Qa * 0.017453292519943295);
    *in_RSI = dVar2;
  }
  else {
    dVar2 = floor(in_XMM0_Qa / 90.0 + 0.5);
    iVar1 = (int)dVar2;
    if (iVar1 < 1) {
      iVar1 = -iVar1;
    }
    switch(iVar1 % 4) {
    case 0:
      *in_RDI = 0.0;
      *in_RSI = 1.0;
      break;
    case 1:
      *in_RDI = (double)(~-(ulong)(0.0 < in_XMM0_Qa) & 0xbff0000000000000 |
                        (ulong)((uint)(-(ulong)(0.0 < in_XMM0_Qa) >> 0x20) & 0x3ff00000) << 0x20);
      *in_RSI = 0.0;
      break;
    case 2:
      *in_RDI = 0.0;
      *in_RSI = -1.0;
      break;
    case 3:
      *in_RDI = (double)(~-(ulong)(0.0 < in_XMM0_Qa) & 0x3ff0000000000000 |
                        (ulong)((uint)(-(ulong)(0.0 < in_XMM0_Qa) >> 0x20) & 0xbff00000) << 0x20);
      *in_RSI = 0.0;
      break;
    default:
      goto switchD_001123a1_default;
    }
  }
  return;
}

Assistant:

void sincosd(double angle, double *s, double *c) {
    int i;

    if (fmod(angle, 90.0) == 0.0) {
        i = abs((int) floor(angle / 90.0 + 0.5)) % 4;
        switch (i) {
        case 0:
            *s = 0.0;
            *c = 1.0;
            return;
        case 1:
            *s = (angle > 0.0) ? 1.0 : -1.0;
            *c = 0.0;
            return;
        case 2:
            *s = 0.0;
            *c = -1.0;
            return;
        case 3:
            *s = (angle > 0.0) ? -1.0 : 1.0;
            *c = 0.0;
            return;
        }
    }

    angle *= D2R;
    *s = sin(angle);
    *c = cos(angle);
}